

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

void __thiscall iqxmlrpc::Client_base::Impl::~Impl(Impl *this)

{
  Client_connection *pCVar1;
  
  pCVar1 = (this->conn_cache).px;
  if (pCVar1 != (Client_connection *)0x0) {
    (*pCVar1->_vptr_Client_connection[1])();
  }
  Client_options::~Client_options(&this->opts);
  return;
}

Assistant:

Impl(
    const iqnet::Inet_addr& addr,
    const std::string& uri,
    const std::string& vhost
  ):
    opts(addr, uri, vhost) {}